

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void readRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  RgbaInputFile *this;
  int *in_RCX;
  int *in_RDX;
  Array2D<Imf_2_5::Rgba> *in_RSI;
  Box<Imath_2_5::Vec2<int>_> *in_RDI;
  Box2i dw;
  RgbaInputFile file;
  size_t in_stack_00000148;
  size_t in_stack_00000150;
  Rgba *in_stack_00000158;
  RgbaInputFile *in_stack_00000160;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  RgbaInputFile *in_stack_ffffffffffffff90;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  RgbaInputFile *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffffd0;
  
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  this = (RgbaInputFile *)Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x115266);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_RDI,in_stack_ffffffffffffff68);
  *in_RDX = (local_60 - local_68) + 1;
  *in_RCX = (local_5c - local_64) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(long)in_stack_ffffffffffffffc0);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,0);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
  Imf_2_5::RgbaInputFile::readPixels
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(this);
  return;
}

Assistant:

void
readRgba1 (const char fileName[],
	   Array2D<Rgba> &pixels,
	   int &width,
	   int &height)
{
    //
    // Read an RGBA image using class RgbaInputFile:
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}